

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

bool string_empty_value::is_empty_value(string *v)

{
  __type _Var1;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  string *v_local;
  
  local_10 = v;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",2,&local_31);
  _Var1 = std::operator==(v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return _Var1;
}

Assistant:

static bool is_empty_value(const std::string& v) { return v == std::string("\0\0", 2); }